

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall
pugi::impl::anon_unknown_0::document_order_comparator::operator()
          (document_order_comparator *this,xpath_node *lhs,xpath_node *rhs)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_node_struct *in_RAX;
  void *pvVar3;
  void *pvVar4;
  xml_attribute xVar5;
  xml_attribute xVar6;
  xml_node_struct *rn;
  xml_node_struct *ln;
  bool bVar7;
  xml_attribute local_28;
  
  local_28._attr = (xml_attribute_struct *)in_RAX;
  pvVar3 = document_buffer_order((xpath_node *)this);
  pvVar4 = document_buffer_order(lhs);
  if (pvVar4 != (void *)0x0 && pvVar3 != (void *)0x0) {
    return pvVar3 < pvVar4;
  }
  if (*(long *)(this + 8) == 0) {
    local_28._attr = *(xml_attribute_struct **)this;
  }
  else {
    xml_node::xml_node((xml_node *)&local_28);
  }
  xVar6._attr = local_28._attr;
  if ((lhs->_attribute)._attr == (xml_attribute_struct *)0x0) {
    local_28._attr = (xml_attribute_struct *)(lhs->_node)._root;
  }
  else {
    xml_node::xml_node((xml_node *)&local_28);
  }
  xVar5._attr = local_28._attr;
  if (*(long *)(this + 8) == 0) {
LAB_0018f478:
    if ((lhs->_attribute)._attr == (xml_attribute_struct *)0x0) goto LAB_0018f5aa;
    pxVar1 = (lhs->_node)._root;
    if (*(long *)(this + 8) == 0) {
      local_28._attr = *(xml_attribute_struct **)this;
    }
    else {
      xml_node::xml_node((xml_node *)&local_28);
    }
    if (pxVar1 == (xml_node_struct *)local_28._attr) {
      return true;
    }
  }
  else {
    if ((lhs->_attribute)._attr == (xml_attribute_struct *)0x0) {
      if (*(long *)(this + 8) != 0) {
        pxVar1 = *(xml_node_struct **)this;
        if ((lhs->_attribute)._attr == (xml_attribute_struct *)0x0) {
          local_28._attr = (xml_attribute_struct *)(lhs->_node)._root;
        }
        else {
          xml_node::xml_node((xml_node *)&local_28);
        }
        if (pxVar1 == (xml_node_struct *)local_28._attr) {
          return false;
        }
        if (*(long *)(this + 8) == 0) {
          if (*(long *)this == 0) {
            xml_node::xml_node((xml_node *)&local_28);
            xVar6._attr = local_28._attr;
          }
          else {
            xml_node::xml_node((xml_node *)&local_28,*(xml_node_struct **)(*(long *)this + 0x18));
            xVar6._attr = local_28._attr;
          }
        }
        else {
          xVar6._attr = (xml_attribute_struct *)*(xml_node_struct **)this;
        }
        goto LAB_0018f5aa;
      }
      goto LAB_0018f478;
    }
    pxVar1 = *(xml_node_struct **)this;
    if ((lhs->_attribute)._attr == (xml_attribute_struct *)0x0) {
      pxVar2 = (lhs->_node)._root;
      if (pxVar2 == (xml_node_struct *)0x0) {
        xml_node::xml_node((xml_node *)&local_28);
        xVar6._attr = local_28._attr;
      }
      else {
        xml_node::xml_node((xml_node *)&local_28,pxVar2->parent);
        xVar6._attr = local_28._attr;
      }
    }
    else {
      xVar6._attr = (xml_attribute_struct *)(lhs->_node)._root;
    }
    xVar5._attr = *(xml_attribute_struct **)(this + 8);
    bVar7 = (xml_node_struct *)xVar5._attr == (xml_node_struct *)0x0;
    if (pxVar1 == (xml_node_struct *)xVar6._attr) {
      if (((xml_node_struct *)xVar5._attr != (xml_node_struct *)0x0) &&
         ((xml_node_struct *)xVar5._attr != (xml_node_struct *)(lhs->_attribute)._attr)) {
        do {
          xml_attribute::xml_attribute
                    (&local_28,(xml_attribute_struct *)((xml_node_struct *)xVar5._attr)->first_child
                    );
          bVar7 = (xml_node_struct *)local_28._attr == (xml_node_struct *)0x0;
          if (bVar7) break;
          xVar5._attr = local_28._attr;
        } while ((xml_node_struct *)local_28._attr != (xml_node_struct *)(lhs->_attribute)._attr);
      }
      return (bool)(bVar7 ^ 1);
    }
    if ((xml_node_struct *)xVar5._attr == (xml_node_struct *)0x0) {
      if (*(long *)this == 0) {
        xml_node::xml_node((xml_node *)&local_28);
        xVar6._attr = local_28._attr;
      }
      else {
        xml_node::xml_node((xml_node *)&local_28,*(xml_node_struct **)(*(long *)this + 0x18));
        xVar6._attr = local_28._attr;
      }
    }
    else {
      xVar6._attr = (xml_attribute_struct *)*(xml_node_struct **)this;
    }
  }
  if ((lhs->_attribute)._attr == (xml_attribute_struct *)0x0) {
    pxVar1 = (lhs->_node)._root;
    if (pxVar1 == (xml_node_struct *)0x0) {
      xml_node::xml_node((xml_node *)&local_28);
      xVar5._attr = local_28._attr;
    }
    else {
      xml_node::xml_node((xml_node *)&local_28,pxVar1->parent);
      xVar5._attr = local_28._attr;
    }
  }
  else {
    xVar5._attr = (xml_attribute_struct *)(lhs->_node)._root;
  }
LAB_0018f5aa:
  if (xVar6._attr == xVar5._attr) {
    return false;
  }
  if (((xml_node_struct *)xVar5._attr == (xml_node_struct *)0x0) ||
     (pxVar1 = (xml_node_struct *)xVar6._attr, pxVar2 = (xml_node_struct *)xVar5._attr,
     (xml_node_struct *)xVar6._attr == (xml_node_struct *)0x0)) {
    return xVar6._attr < xVar5._attr;
  }
  while ((rn = pxVar2, ln = pxVar1, ln != (xml_node_struct *)0x0 && (rn != (xml_node_struct *)0x0)))
  {
    pxVar1 = ln->parent;
    pxVar2 = rn->parent;
    if (ln->parent == rn->parent) goto LAB_0018f628;
  }
  bVar7 = ln == (xml_node_struct *)0x0;
  if (!bVar7) {
    do {
      ln = ln->parent;
      xVar6._attr = (xml_attribute_struct *)((xml_node_struct *)xVar6._attr)->parent;
    } while (ln != (xml_node_struct *)0x0);
  }
  for (; rn != (xml_node_struct *)0x0; rn = rn->parent) {
    xVar5._attr = (xml_attribute_struct *)((xml_node_struct *)xVar5._attr)->parent;
  }
  if (xVar6._attr == xVar5._attr) {
    return bVar7;
  }
  do {
    ln = (xml_node_struct *)xVar6._attr;
    rn = (xml_node_struct *)xVar5._attr;
    xVar5._attr = (xml_attribute_struct *)rn->parent;
    xVar6._attr = (xml_attribute_struct *)ln->parent;
  } while (ln->parent != rn->parent);
LAB_0018f628:
  bVar7 = node_is_before_sibling(ln,rn);
  return bVar7;
}

Assistant:

bool operator()(const xpath_node& lhs, const xpath_node& rhs) const
		{
			// optimized document order based check
			const void* lo = document_buffer_order(lhs);
			const void* ro = document_buffer_order(rhs);

			if (lo && ro) return lo < ro;

			// slow comparison
			xml_node ln = lhs.node(), rn = rhs.node();

			// compare attributes
			if (lhs.attribute() && rhs.attribute())
			{
				// shared parent
				if (lhs.parent() == rhs.parent())
				{
					// determine sibling order
					for (xml_attribute a = lhs.attribute(); a; a = a.next_attribute())
						if (a == rhs.attribute())
							return true;

					return false;
				}

				// compare attribute parents
				ln = lhs.parent();
				rn = rhs.parent();
			}
			else if (lhs.attribute())
			{
				// attributes go after the parent element
				if (lhs.parent() == rhs.node()) return false;

				ln = lhs.parent();
			}
			else if (rhs.attribute())
			{
				// attributes go after the parent element
				if (rhs.parent() == lhs.node()) return true;

				rn = rhs.parent();
			}

			if (ln == rn) return false;

			if (!ln || !rn) return ln < rn;

			return node_is_before(ln.internal_object(), rn.internal_object());
		}